

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdPackage.cpp
# Opt level: O1

PackageSymbol * slang::ast::builtins::createStdPackage(Compilation *c)

{
  Scope *pSVar1;
  TypedBumpAllocator<slang::ast::GenericClassDefSymbol> *this;
  Type *retType;
  Segment *pSVar2;
  undefined6 uVar3;
  ClassType *pCVar4;
  Compilation *pCVar5;
  PackageSymbol *pPVar6;
  EnumValueSymbol *this_00;
  TransparentMemberSymbol *member;
  TypeAliasType *retType_00;
  Type *pTVar7;
  GenericClassDefSymbol *pGVar8;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar9;
  long lVar10;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view name_06;
  string_view name_07;
  string_view name_08;
  string_view name_09;
  string_view name_10;
  string_view name_11;
  string_view name_12;
  string_view name_13;
  string_view name_14;
  string_view name_15;
  string_view name_16;
  string_view name_17;
  string_view name_18;
  string_view name_19;
  string_view name_20;
  string_view name_21;
  string_view name_22;
  string_view name_23;
  string_view name_24;
  string_view name_25;
  SpecializeFunc specializeFunc;
  SpecializeFunc specializeFunc_00;
  ClassBuilder builder;
  SVInt defaultOne;
  MethodBuilder self;
  MethodBuilder srandom;
  SVInt defaultZero;
  MethodBuilder set_randstate;
  char *name;
  MethodBuilder try_get;
  MethodBuilder get;
  ClassBuilder local_3c8;
  Scope *local_3b8;
  Compilation *local_3b0;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_3a8;
  undefined1 local_388;
  _Storage<slang::SVInt,_false> local_380;
  char local_370;
  PackageSymbol *local_368;
  EnumType *local_360;
  _Storage<slang::SVInt,_false> local_358;
  char local_348;
  anon_union_8_3_62382250_for_ParameterDecl_0 local_340;
  uint local_338;
  undefined1 uStack_334;
  byte bStack_333;
  undefined2 uStack_332;
  Scope *local_2f0;
  _Storage<slang::SVInt,_false> local_2e8;
  char local_2d8;
  _Storage<slang::SVInt,_false> local_298;
  char local_288;
  _Storage<slang::SVInt,_false> local_248;
  char local_238;
  _Storage<slang::SVInt,_false> local_1f8;
  char local_1e8;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_1a8;
  uint local_1a0;
  ushort local_19c;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  MethodBuilder local_170;
  MethodBuilder local_120;
  MethodBuilder local_d0;
  MethodBuilder local_80;
  
  local_340._0_4_ = 1;
  local_368 = BumpAllocator::
              emplace<slang::ast::PackageSymbol,slang::ast::Compilation&,char_const(&)[4],slang::SourceLocation_const&,slang::ast::NetType_const&,slang::ast::VariableLifetime>
                        (&c->super_BumpAllocator,c,(char (*) [4])0x47d83e,
                         (SourceLocation *)&SourceLocation::NoLocation,c->wireNetType,
                         (VariableLifetime *)&local_340);
  local_3b8 = &local_368->super_Scope;
  name_10._M_str = "process";
  name_10._M_len = 7;
  ClassBuilder::ClassBuilder(&local_3c8,c,name_10);
  (local_3c8.type)->isAbstract = true;
  (local_3c8.type)->isFinal = true;
  local_1a8.pVal = (uint64_t *)&(local_3c8.type)->super_Scope;
  local_1a0 = 1;
  local_198 = 0;
  uStack_190 = 0;
  local_188 = 0;
  uStack_180 = 0;
  local_178 = 0;
  local_360 = BumpAllocator::
              emplace<slang::ast::EnumType,slang::ast::Compilation&,slang::SourceLocation_const&,slang::ast::Type_const&,slang::ast::ASTContext&>
                        (&c->super_BumpAllocator,c,(SourceLocation *)&SourceLocation::NoLocation,
                         c->intType,(ASTContext *)&local_1a8);
  local_360->systemId = 0x7ffff7ff;
  local_2f0 = &local_360->super_Scope;
  aVar9.valueSyntax = (ParameterDeclarationSyntax *)0x0;
  lVar10 = 0;
  local_3b0 = c;
  do {
    local_120.compilation = *(Compilation **)((long)&PTR_anon_var_dwarf_15e974c_005e34a0 + lVar10);
    this_00 = BumpAllocator::
              emplace<slang::ast::EnumValueSymbol,char_const*&,slang::SourceLocation_const&>
                        (&c->super_BumpAllocator,(char **)&local_120,
                         (SourceLocation *)&SourceLocation::NoLocation);
    (this_00->super_ValueSymbol).declaredType.type = (Type *)local_360;
    Scope::insertMember(local_2f0,(Symbol *)this_00,(local_360->super_Scope).lastMember,false,true);
    local_338 = 0x20;
    uStack_334 = 1;
    bStack_333 = 0;
    local_340 = aVar9;
    SVInt::clearUnusedBits((SVInt *)&local_340);
    local_3a8._0_8_ = local_340;
    local_3a8._8_4_ = local_338;
    local_3a8._13_1_ = bStack_333;
    local_3a8._12_1_ = uStack_334;
    if (0x40 < local_338 || (bStack_333 & 1) != 0) {
      local_340.valueSyntax = (ParameterDeclarationSyntax *)0x0;
    }
    local_388 = 1;
    EnumValueSymbol::setValue(this_00,(ConstantValue *)&local_3a8);
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)&local_3a8);
    if (((0x40 < local_338) || ((bStack_333 & 1) != 0)) &&
       (local_340.valueSyntax != (ParameterDeclarationSyntax *)0x0)) {
      operator_delete__(local_340.valueSyntax);
    }
    c = local_3b0;
    pCVar4 = local_3c8.type;
    pSVar1 = &(local_3c8.type)->super_Scope;
    member = BumpAllocator::
             emplace<slang::ast::TransparentMemberSymbol,slang::ast::EnumValueSymbol&>
                       (&local_3b0->super_BumpAllocator,this_00);
    Scope::insertMember(pSVar1,&member->super_Symbol,(pCVar4->super_Scope).lastMember,false,true);
    lVar10 = lVar10 + 8;
    aVar9.valueSyntax =
         (ParameterDeclarationSyntax *)
         ((long)&((aVar9.valueSyntax)->super_ParameterDeclarationBaseSyntax).super_SyntaxNode.kind +
         1);
  } while (lVar10 != 0x28);
  retType_00 = BumpAllocator::
               emplace<slang::ast::TypeAliasType,char_const(&)[6],slang::SourceLocation_const&>
                         (&c->super_BumpAllocator,(char (*) [6])0x47f2e4,
                          (SourceLocation *)&SourceLocation::NoLocation);
  (retType_00->targetType).type = (Type *)local_360;
  Scope::insertMember(&(local_3c8.type)->super_Scope,(Symbol *)retType_00,
                      ((local_3c8.type)->super_Scope).lastMember,false,true);
  pTVar7 = c->voidType;
  name_11._M_str = "self";
  name_11._M_len = 4;
  ClassBuilder::addMethod
            ((MethodBuilder *)&local_340,&local_3c8,name_11,&(local_3c8.type)->super_Type,Function);
  MethodBuilder::addFlags((MethodBuilder *)&local_340,(bitmask<slang::ast::MethodFlags>)0x4);
  name_12._M_str = "status";
  name_12._M_len = 6;
  ClassBuilder::addMethod(&local_120,&local_3c8,name_12,&retType_00->super_Type,Function);
  MethodBuilder::~MethodBuilder(&local_120);
  name_13._M_str = "kill";
  name_13._M_len = 4;
  ClassBuilder::addMethod(&local_80,&local_3c8,name_13,pTVar7,Function);
  MethodBuilder::~MethodBuilder(&local_80);
  name_14._M_str = "await";
  name_14._M_len = 5;
  ClassBuilder::addMethod(&local_d0,&local_3c8,name_14,pTVar7,Task);
  MethodBuilder::~MethodBuilder(&local_d0);
  name_15._M_str = "suspend";
  name_15._M_len = 7;
  ClassBuilder::addMethod((MethodBuilder *)&local_1f8._M_value,&local_3c8,name_15,pTVar7,Function);
  MethodBuilder::~MethodBuilder((MethodBuilder *)&local_1f8._M_value);
  name_16._M_str = "resume";
  name_16._M_len = 6;
  ClassBuilder::addMethod((MethodBuilder *)&local_248._M_value,&local_3c8,name_16,pTVar7,Function);
  MethodBuilder::~MethodBuilder((MethodBuilder *)&local_248._M_value);
  name_17._M_str = "get_randstate";
  name_17._M_len = 0xd;
  ClassBuilder::addMethod
            ((MethodBuilder *)&local_298._M_value,&local_3c8,name_17,c->stringType,Function);
  MethodBuilder::~MethodBuilder((MethodBuilder *)&local_298._M_value);
  name_18._M_str = "srandom";
  name_18._M_len = 7;
  ClassBuilder::addMethod((MethodBuilder *)&local_2e8._M_value,&local_3c8,name_18,pTVar7,Function);
  pPVar6 = local_368;
  local_370 = '\0';
  name_00._M_str = "seed";
  name_00._M_len = 4;
  MethodBuilder::addArg
            ((MethodBuilder *)&local_2e8._M_value,name_00,c->intType,In,
             (optional<slang::SVInt> *)&local_380._M_value);
  if (((local_370 == '\x01') &&
      ((local_370 = '\0', 0x40 < local_380._M_value.super_SVIntStorage.bitWidth ||
       ((local_380._M_value.super_SVIntStorage.unknownFlag & 1U) != 0)))) &&
     (local_380._M_value.super_SVIntStorage.field_0.val != 0)) {
    operator_delete__((void *)local_380._M_value.super_SVIntStorage.field_0);
  }
  name_19._M_str = "set_randstate";
  name_19._M_len = 0xd;
  ClassBuilder::addMethod(&local_170,&local_3c8,name_19,pTVar7,Function);
  local_348 = '\0';
  name_01._M_str = "state";
  name_01._M_len = 5;
  MethodBuilder::addArg
            (&local_170,name_01,c->stringType,In,(optional<slang::SVInt> *)&local_358._M_value);
  if (((local_348 == '\x01') &&
      ((local_348 = '\0', 0x40 < local_358._M_value.super_SVIntStorage.bitWidth ||
       ((local_358._M_value.super_SVIntStorage.unknownFlag & 1U) != 0)))) &&
     (local_358._M_value.super_SVIntStorage.field_0.val != 0)) {
    operator_delete__((void *)local_358._M_value.super_SVIntStorage.field_0);
  }
  MethodBuilder::~MethodBuilder(&local_170);
  MethodBuilder::~MethodBuilder((MethodBuilder *)&local_2e8._M_value);
  MethodBuilder::~MethodBuilder((MethodBuilder *)&local_340);
  Scope::insertMember(local_3b8,(Symbol *)local_3c8.type,(pPVar6->super_Scope).lastMember,false,true
                     );
  pCVar5 = local_3b0;
  name_20._M_str = "semaphore";
  name_20._M_len = 9;
  ClassBuilder::ClassBuilder((ClassBuilder *)&local_170,local_3b0,name_20);
  pTVar7 = pCVar5->intType;
  retType = pCVar5->voidType;
  local_1a8.val = 0;
  local_1a0 = 0x20;
  local_19c = 1;
  SVInt::clearUnusedBits((SVInt *)&local_1a8);
  local_3a8._8_4_ = 0x20;
  local_3a8._12_2_ = 1;
  local_3a8._0_8_ = (void *)0x1;
  SVInt::clearUnusedBits((SVInt *)&local_3a8);
  name_21._M_str = "new";
  name_21._M_len = 3;
  ClassBuilder::addMethod
            ((MethodBuilder *)&local_340,(ClassBuilder *)&local_170,name_21,retType,Function);
  MethodBuilder::addFlags((MethodBuilder *)&local_340,(bitmask<slang::ast::MethodFlags>)0x8);
  pSVar1 = local_3b8;
  SVInt::SVInt(&local_1f8._M_value,(SVIntStorage *)&local_1a8);
  local_1e8 = '\x01';
  name_02._M_str = "keyCount";
  name_02._M_len = 8;
  MethodBuilder::addArg
            ((MethodBuilder *)&local_340,name_02,pTVar7,In,
             (optional<slang::SVInt> *)&local_1f8._M_value);
  if ((local_1e8 == '\x01') &&
     (((local_1e8 = '\0', 0x40 < local_1f8._M_value.super_SVIntStorage.bitWidth ||
       ((local_1f8._M_value.super_SVIntStorage.unknownFlag & 1U) != 0)) &&
      (local_1f8._M_value.super_SVIntStorage.field_0.val != 0)))) {
    operator_delete__((void *)local_1f8._M_value.super_SVIntStorage.field_0);
  }
  name_22._M_str = "put";
  name_22._M_len = 3;
  ClassBuilder::addMethod(&local_120,(ClassBuilder *)&local_170,name_22,retType,Function);
  SVInt::SVInt(&local_248._M_value,(SVIntStorage *)&local_3a8);
  local_238 = '\x01';
  name_03._M_str = "keyCount";
  name_03._M_len = 8;
  MethodBuilder::addArg(&local_120,name_03,pTVar7,In,(optional<slang::SVInt> *)&local_248._M_value);
  if (((local_238 == '\x01') &&
      ((local_238 = '\0', 0x40 < local_248._M_value.super_SVIntStorage.bitWidth ||
       ((local_248._M_value.super_SVIntStorage.unknownFlag & 1U) != 0)))) &&
     (local_248._M_value.super_SVIntStorage.field_0.val != 0)) {
    operator_delete__((void *)local_248._M_value.super_SVIntStorage.field_0);
  }
  name_23._M_str = "get";
  name_23._M_len = 3;
  ClassBuilder::addMethod(&local_80,(ClassBuilder *)&local_170,name_23,retType,Task);
  SVInt::SVInt(&local_298._M_value,(SVIntStorage *)&local_3a8);
  local_288 = '\x01';
  name_04._M_str = "keyCount";
  name_04._M_len = 8;
  MethodBuilder::addArg(&local_80,name_04,pTVar7,In,(optional<slang::SVInt> *)&local_298._M_value);
  if (((local_288 == '\x01') &&
      ((local_288 = '\0', 0x40 < local_298._M_value.super_SVIntStorage.bitWidth ||
       ((local_298._M_value.super_SVIntStorage.unknownFlag & 1U) != 0)))) &&
     (local_298._M_value.super_SVIntStorage.field_0.val != 0)) {
    operator_delete__((void *)local_298._M_value.super_SVIntStorage.field_0);
  }
  name_24._M_str = "try_get";
  name_24._M_len = 7;
  ClassBuilder::addMethod(&local_d0,(ClassBuilder *)&local_170,name_24,pTVar7,Function);
  SVInt::SVInt(&local_2e8._M_value,(SVIntStorage *)&local_3a8);
  local_2d8 = '\x01';
  name_05._M_str = "keyCount";
  name_05._M_len = 8;
  MethodBuilder::addArg(&local_d0,name_05,pTVar7,In,(optional<slang::SVInt> *)&local_2e8._M_value);
  if ((local_2d8 == '\x01') &&
     (((local_2d8 = '\0', 0x40 < local_2e8._M_value.super_SVIntStorage.bitWidth ||
       ((local_2e8._M_value.super_SVIntStorage.unknownFlag & 1U) != 0)) &&
      (local_2e8._M_value.super_SVIntStorage.field_0.val != 0)))) {
    operator_delete__((void *)local_2e8._M_value.super_SVIntStorage.field_0);
  }
  MethodBuilder::~MethodBuilder(&local_d0);
  MethodBuilder::~MethodBuilder(&local_80);
  MethodBuilder::~MethodBuilder(&local_120);
  MethodBuilder::~MethodBuilder((MethodBuilder *)&local_340);
  if (((0x40 < (uint)local_3a8._8_4_) || ((local_3a8._12_2_ & 0x100) != 0)) &&
     ((void *)local_3a8._0_8_ != (void *)0x0)) {
    operator_delete__((void *)local_3a8._0_8_);
  }
  if (((0x40 < local_1a0) || ((local_19c & 0x100) != 0)) && ((void *)local_1a8.val != (void *)0x0))
  {
    operator_delete__(local_1a8.pVal);
  }
  Scope::insertMember(pSVar1,&(local_170.symbol)->super_Symbol,(pPVar6->super_Scope).lastMember,
                      false,true);
  this = &local_3b0->genericClassAllocator;
  pSVar2 = (local_3b0->genericClassAllocator).super_BumpAllocator.head;
  pGVar8 = (GenericClassDefSymbol *)((ulong)(pSVar2->current + 7) & 0xfffffffffffffff8);
  if ((GenericClassDefSymbol *)(local_3b0->genericClassAllocator).super_BumpAllocator.endPtr <
      pGVar8 + 1) {
    pGVar8 = (GenericClassDefSymbol *)
             BumpAllocator::allocateSlow(&this->super_BumpAllocator,0x2f0,8);
  }
  else {
    pSVar2->current = (byte *)(pGVar8 + 1);
  }
  name_06._M_str = "mailbox";
  name_06._M_len = 7;
  specializeFunc.callable = (intptr_t)&local_120;
  specializeFunc.callback =
       function_ref<void(slang::ast::Compilation&,slang::ast::ClassType&,slang::SourceLocation)>::
       callback_fn<slang::ast::builtins::createMailboxClass(slang::ast::Compilation&)::__0>;
  GenericClassDefSymbol::GenericClassDefSymbol
            (pGVar8,name_06,(SourceLocation)0xffffffffffffffff,specializeFunc);
  pCVar5 = local_3b0;
  pTVar7 = Compilation::getType(local_3b0,Untyped);
  name_07._M_str = "T";
  name_07._M_len = 1;
  DefinitionSymbol::ParameterDecl::ParameterDecl
            ((ParameterDecl *)&local_340,name_07,(SourceLocation)0xffffffffffffffff,false,true,
             pTVar7);
  GenericClassDefSymbol::addParameterDecl(pGVar8,(ParameterDecl *)&local_340);
  pPVar6 = local_368;
  pSVar1 = local_3b8;
  Scope::insertMember(local_3b8,&pGVar8->super_Symbol,(local_368->super_Scope).lastMember,false,true
                     );
  name_25._M_str = "randomize";
  name_25._M_len = 9;
  MethodBuilder::MethodBuilder((MethodBuilder *)&local_340,pCVar5,name_25,pCVar5->intType,Function);
  MethodBuilder::addFlags((MethodBuilder *)&local_340,(bitmask<slang::ast::MethodFlags>)0x400);
  uVar3 = CONCAT15(bStack_333,CONCAT14(uStack_334,local_338));
  MethodBuilder::~MethodBuilder((MethodBuilder *)&local_340);
  Scope::insertMember(pSVar1,(Symbol *)CONCAT26(uStack_332,uVar3),(pPVar6->super_Scope).lastMember,
                      false,true);
  pSVar2 = (pCVar5->genericClassAllocator).super_BumpAllocator.head;
  pGVar8 = (GenericClassDefSymbol *)((ulong)(pSVar2->current + 7) & 0xfffffffffffffff8);
  if ((GenericClassDefSymbol *)(pCVar5->genericClassAllocator).super_BumpAllocator.endPtr <
      pGVar8 + 1) {
    pGVar8 = (GenericClassDefSymbol *)
             BumpAllocator::allocateSlow(&this->super_BumpAllocator,0x2f0,8);
  }
  else {
    pSVar2->current = (byte *)(pGVar8 + 1);
  }
  name_08._M_str = "weak_reference";
  name_08._M_len = 0xe;
  specializeFunc_00.callable = (intptr_t)&local_120;
  specializeFunc_00.callback =
       function_ref<void(slang::ast::Compilation&,slang::ast::ClassType&,slang::SourceLocation)>::
       callback_fn<slang::ast::builtins::createWeakReference(slang::ast::Compilation&)::__0>;
  GenericClassDefSymbol::GenericClassDefSymbol
            (pGVar8,name_08,(SourceLocation)0xffffffffffffffff,specializeFunc_00);
  name_09._M_str = "T";
  name_09._M_len = 1;
  DefinitionSymbol::ParameterDecl::ParameterDecl
            ((ParameterDecl *)&local_340,name_09,(SourceLocation)0xffffffffffffffff,false,true,
             (Type *)0x0);
  GenericClassDefSymbol::addParameterDecl(pGVar8,(ParameterDecl *)&local_340);
  Scope::insertMember(local_3b8,&pGVar8->super_Symbol,(pPVar6->super_Scope).lastMember,false,true);
  return pPVar6;
}

Assistant:

const PackageSymbol& createStdPackage(Compilation& c) {
    auto pkg = c.emplace<PackageSymbol>(c, "std", NL, c.getWireNetType(), VariableLifetime::Static);
    pkg->addMember(createProcessClass(c));
    pkg->addMember(createSemaphoreClass(c));
    pkg->addMember(createMailboxClass(c));
    pkg->addMember(createRandomizeFunc(c));
    pkg->addMember(createWeakReference(c));

    return *pkg;
}